

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop,bool chain)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  pointer pcVar4;
  cmLocalGenerator *pcVar5;
  cmMakefile *this_00;
  cmState *pcVar6;
  char *retVal;
  const_iterator end_2;
  const_iterator it_2;
  string sep_2;
  const_iterator end_1;
  const_iterator it_1;
  string sep_1;
  const_iterator end;
  const_iterator it;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  Snapshot parent;
  bool chain_local;
  string *prop_local;
  cmMakefile *this_local;
  
  parent.Position.Position._7_1_ = chain;
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  std::__cxx11::string::operator=
            ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,"");
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    cmState::Snapshot::GetBuildsystemDirectoryParent((Snapshot *)local_40,&this->StateSnapshot);
    bVar1 = cmState::Snapshot::IsValid((Snapshot *)local_40);
    if (bVar1) {
      this_local = (cmMakefile *)cmState::Snapshot::GetCurrentSourceDirectory((Snapshot *)local_40);
    }
    else {
      this_local = (cmMakefile *)0x90a50f;
    }
  }
  else {
    bVar1 = std::operator==(prop,"INCLUDE_REGULAR_EXPRESSION");
    if (bVar1) {
      pcVar3 = GetIncludeRegularExpression(this);
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,pcVar3)
      ;
      this_local = (cmMakefile *)std::__cxx11::string::c_str();
    }
    else {
      bVar1 = std::operator==(prop,"LISTFILE_STACK");
      if (bVar1) {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_60,&this->ListFileStack,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        this_local = (cmMakefile *)std::__cxx11::string::c_str();
      }
      else {
        bVar1 = std::operator==(prop,"CACHE_VARIABLES");
        if (bVar1) {
          pcVar6 = GetState(this);
          cmState::GetCacheEntryKeys_abi_cxx11_(&local_98,pcVar6);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_80,&local_98,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_98);
          this_local = (cmMakefile *)std::__cxx11::string::c_str();
        }
        else {
          bVar1 = std::operator==(prop,"VARIABLES");
          if (bVar1) {
            GetDefinitions_abi_cxx11_(&local_e0,this);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_c8,&local_e0,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_e0);
            this_local = (cmMakefile *)std::__cxx11::string::c_str();
          }
          else {
            bVar1 = std::operator==(prop,"MACROS");
            if (bVar1) {
              GetListOfMacros(this,&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                             );
              this_local = (cmMakefile *)std::__cxx11::string::c_str();
            }
            else {
              bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
              if (bVar1) {
                r = GetLinkDirectories_abi_cxx11_(this);
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)((long)&sep.field_2 + 8),r,";");
                std::__cxx11::string::operator=
                          ((string *)
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                           (string *)(sep.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
                this_local = (cmMakefile *)std::__cxx11::string::c_str();
              }
              else {
                bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
                if (bVar1) {
                  std::__cxx11::string::string((string *)&it);
                  end = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                                  (&this->IncludeDirectoriesEntries);
                  sep_1.field_2._8_8_ =
                       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                                 (&this->IncludeDirectoriesEntries);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&end,(__normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                                                  *)((long)&sep_1.field_2 + 8)), bVar1) {
                    std::__cxx11::string::operator+=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)&it);
                    pcVar4 = __gnu_cxx::
                             __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                             ::operator->(&end);
                    std::__cxx11::string::operator+=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)pcVar4);
                    std::__cxx11::string::operator=((string *)&it,";");
                    __gnu_cxx::
                    __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                    ::operator++(&end);
                  }
                  this_local = (cmMakefile *)std::__cxx11::string::c_str();
                  std::__cxx11::string::~string((string *)&it);
                }
                else {
                  bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
                  if (bVar1) {
                    std::__cxx11::string::string((string *)&it_1);
                    end_1 = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
                            begin(&this->CompileOptionsEntries);
                    sep_2.field_2._8_8_ =
                         std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                                   (&this->CompileOptionsEntries);
                    while (bVar1 = __gnu_cxx::operator!=
                                             (&end_1,(
                                                  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                                                  *)((long)&sep_2.field_2 + 8)), bVar1) {
                      std::__cxx11::string::operator+=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)&it_1);
                      pcVar4 = __gnu_cxx::
                               __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                               ::operator->(&end_1);
                      std::__cxx11::string::operator+=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)pcVar4);
                      std::__cxx11::string::operator=((string *)&it_1,";");
                      __gnu_cxx::
                      __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                      ::operator++(&end_1);
                    }
                    this_local = (cmMakefile *)std::__cxx11::string::c_str();
                    std::__cxx11::string::~string((string *)&it_1);
                  }
                  else {
                    bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
                    if (bVar1) {
                      std::__cxx11::string::string((string *)&it_2);
                      end_2 = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
                              begin(&this->CompileDefinitionsEntries);
                      retVal = (char *)std::
                                       vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                                       ::end(&this->CompileDefinitionsEntries);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&end_2,(
                                                  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                                                  *)&retVal), bVar1) {
                        std::__cxx11::string::operator+=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)&it_2);
                        pcVar4 = __gnu_cxx::
                                 __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                                 ::operator->(&end_2);
                        std::__cxx11::string::operator+=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)pcVar4);
                        std::__cxx11::string::operator=((string *)&it_2,";");
                        __gnu_cxx::
                        __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                        ::operator++(&end_2);
                      }
                      this_local = (cmMakefile *)std::__cxx11::string::c_str();
                      std::__cxx11::string::~string((string *)&it_2);
                    }
                    else {
                      this_local = (cmMakefile *)
                                   cmPropertyMap::GetPropertyValue(&this->Properties,prop);
                      if ((this_local == (cmMakefile *)0x0) &&
                         ((parent.Position.Position._7_1_ & 1) != 0)) {
                        pcVar5 = cmLocalGenerator::GetParent(this->LocalGenerator);
                        if (pcVar5 == (cmLocalGenerator *)0x0) {
                          pcVar6 = GetState(this);
                          this_local = (cmMakefile *)cmState::GetGlobalProperty(pcVar6,prop);
                        }
                        else {
                          pcVar5 = cmLocalGenerator::GetParent(this->LocalGenerator);
                          this_00 = cmLocalGenerator::GetMakefile(pcVar5);
                          this_local = (cmMakefile *)
                                       GetProperty(this_00,prop,
                                                   (bool)(parent.Position.Position._7_1_ & 1));
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char *cmMakefile::GetProperty(const std::string& prop,
                                    bool chain) const
{
  // watch for specific properties
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY")
    {
    cmState::Snapshot parent =
        this->StateSnapshot.GetBuildsystemDirectoryParent();
    if(parent.IsValid())
      {
      return parent.GetCurrentSourceDirectory();
      }
    return "";
    }
  else if (prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    output = this->GetIncludeRegularExpression();
    return output.c_str();
    }
  else if (prop == "LISTFILE_STACK")
    {
    output = cmJoin(this->ListFileStack, ";");
    return output.c_str();
    }
  else if ( prop == "CACHE_VARIABLES" )
    {
    output = cmJoin(this->GetState()->GetCacheEntryKeys(), ";");
    return output.c_str();
    }
  else if (prop == "VARIABLES")
    {
    output = cmJoin(this->GetDefinitions(), ";");
    return output.c_str();
    }
  else if (prop == "MACROS")
    {
    this->GetListOfMacros(output);
    return output.c_str();
    }
  else if (prop == "LINK_DIRECTORIES")
    {
    output = cmJoin(this->GetLinkDirectories(), ";");
    return output.c_str();
    }
  else if (prop == "INCLUDE_DIRECTORIES")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->IncludeDirectoriesEntries.begin(),
        end = this->IncludeDirectoriesEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_OPTIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileOptionsEntries.begin(),
        end = this->CompileOptionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_DEFINITIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileDefinitionsEntries.begin(),
        end = this->CompileDefinitionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal && chain)
    {
    if(this->LocalGenerator->GetParent())
      {
      return this->LocalGenerator->GetParent()->GetMakefile()->
        GetProperty(prop, chain);
      }
    return this->GetState()->GetGlobalProperty(prop);
    }

  return retVal;
}